

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_pruning.hpp
# Opt level: O2

pair<unsigned_long,_unsigned_long>
IntegratorXX::detail::get_robust_low_med_sizes<IntegratorXX::Delley<double>>(AngularSize asz)

{
  ulong uVar1;
  int64_t order;
  unsigned_long uVar2;
  runtime_error *this;
  ulong order_00;
  pair<unsigned_long,_unsigned_long> pVar3;
  
  uVar1 = quadrature_traits<IntegratorXX::Delley<double>,_void>::algebraic_order_by_npts(asz);
  if (-1 < (long)uVar1) {
    order_00 = uVar1 - 6;
    if (uVar1 < 7) {
      order_00 = uVar1;
    }
    order = quadrature_traits<IntegratorXX::Delley<double>,_void>::next_algebraic_order(order_00);
    uVar2 = quadrature_traits<IntegratorXX::Delley<double>,_void>::npts_by_algebraic_order(order);
    pVar3.second = uVar2;
    pVar3.first = 0x1a;
    return pVar3;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Invalid Base Grid");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto get_robust_low_med_sizes(AngularSize asz) {
  using traits = quadrature_traits<AngularQuad>;
  const auto base_order = traits::algebraic_order_by_npts(asz);
  if( base_order < 0 ) throw std::runtime_error("Invalid Base Grid");

  const auto med_order = 
    traits::next_algebraic_order(base_order > 6 ? base_order-6 : base_order);
  const auto low_order = traits::next_algebraic_order(7);

  AngularSize med_sz(traits::npts_by_algebraic_order(med_order));
  AngularSize low_sz(traits::npts_by_algebraic_order(low_order));

  return std::make_pair(low_sz, med_sz);
}